

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void arm_post_translate_insn(DisasContext_conflict1 *dc)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGLabel *a1;
  
  if ((dc->condjmp != 0) && ((dc->base).is_jmp == DISAS_NEXT)) {
    tcg_ctx = dc->uc->tcg_ctx;
    a1 = dc->condlabel;
    *(uint *)a1 = *(uint *)a1 | 1;
    tcg_gen_op1_aarch64(tcg_ctx,INDEX_op_set_label,(TCGArg)a1);
    dc->condjmp = 0;
  }
  translator_loop_temp_check_aarch64(&dc->base);
  return;
}

Assistant:

static void arm_post_translate_insn(DisasContext *dc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    if (dc->condjmp && !dc->base.is_jmp) {
        gen_set_label(tcg_ctx, dc->condlabel);
        dc->condjmp = 0;
    }
    translator_loop_temp_check(&dc->base);
}